

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

PerspectiveCameraData *
embree::SceneGraph::lerp(PerspectiveCameraData *a,PerspectiveCameraData *b,float t)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  PerspectiveCameraData *in_RDI;
  float in_XMM0_Da;
  float fov;
  Vec3fa up;
  Vec3fa to;
  Vec3fa from;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_6c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_6b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_6a8 [3];
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 *local_660;
  undefined8 *local_658;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 *local_630;
  undefined8 *local_628;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_620;
  undefined8 local_618;
  undefined8 uStack_610;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_5f0;
  float local_5e0;
  float local_5dc;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 *local_5c8;
  float local_5b4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_5b0;
  float local_5a4;
  undefined8 *local_5a0;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float local_57c;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 *local_560;
  undefined8 *local_550;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_548;
  undefined8 *local_540;
  undefined8 *local_538;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_530;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined8 local_518;
  undefined8 uStack_510;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_4f8;
  undefined8 *local_4e8;
  undefined8 *local_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 *local_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 *local_488;
  undefined8 *local_480;
  float local_474;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_470;
  float local_464;
  undefined8 *local_460;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_43c;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 *local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_3b8;
  undefined8 *local_3b0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined8 *local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 *local_348;
  undefined8 *local_340;
  float local_334;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_330;
  float local_324;
  undefined8 *local_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2c8;
  undefined8 *local_2c0;
  undefined8 *local_2b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2b0;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined8 local_298;
  undefined8 uStack_290;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined8 *local_220;
  undefined1 local_218 [32];
  undefined8 *local_1f8;
  undefined1 *local_1e8;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 *local_1a0;
  undefined1 *local_190;
  undefined1 local_168 [16];
  undefined8 *local_158;
  undefined8 *local_148;
  undefined8 *local_140;
  undefined1 *local_138;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined8 *local_f0;
  undefined1 *local_e0;
  undefined1 local_b8 [16];
  undefined8 *local_a8;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined1 *local_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 *local_40;
  undefined1 *local_30;
  float local_c;
  float local_8;
  float local_4;
  
  local_5f0 = local_6a8;
  local_5b4 = 1.0 - in_XMM0_Da;
  local_5c8 = &local_618;
  local_1e8 = local_218;
  uVar1 = *in_RDX;
  uVar2 = in_RDX[1];
  local_1d8._0_4_ = (float)uVar1;
  local_1d8._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_1d0._0_4_ = (float)uVar2;
  uStack_1d0._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_1b8 = in_XMM0_Da * (float)local_1d8;
  fStack_1b4 = in_XMM0_Da * local_1d8._4_4_;
  fStack_1b0 = in_XMM0_Da * (float)uStack_1d0;
  fStack_1ac = in_XMM0_Da * uStack_1d0._4_4_;
  local_5a0 = &local_5d8;
  local_4c8 = CONCAT44(local_5b4,local_5b4);
  uStack_4c0 = CONCAT44(local_5b4,local_5b4);
  local_538 = &local_578;
  uVar3 = *in_RSI;
  uVar4 = in_RSI[1];
  local_4d8._0_4_ = (float)uVar3;
  local_4d8._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_4d0._0_4_ = (float)uVar4;
  uStack_4d0._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_4b8 = local_5b4 * (float)local_4d8;
  fStack_4b4 = local_5b4 * local_4d8._4_4_;
  fStack_4b0 = local_5b4 * (float)uStack_4d0;
  fStack_4ac = local_5b4 * uStack_4d0._4_4_;
  local_518 = CONCAT44(fStack_4b4,local_4b8);
  uStack_510 = CONCAT44(fStack_4ac,fStack_4b0);
  local_528 = (float)local_618;
  fStack_524 = (float)((ulong)local_618 >> 0x20);
  fStack_520 = (float)uStack_610;
  fStack_51c = (float)((ulong)uStack_610 >> 0x20);
  local_508 = local_4b8 + local_528;
  fStack_504 = fStack_4b4 + fStack_524;
  fStack_500 = fStack_4b0 + fStack_520;
  fStack_4fc = fStack_4ac + fStack_51c;
  local_6a8[0]._0_8_ = CONCAT44(fStack_504,local_508);
  local_6a8[0]._8_8_ = CONCAT44(fStack_4fc,fStack_500);
  local_628 = in_RSI + 2;
  local_630 = in_RDX + 2;
  local_620 = &local_6b8;
  local_474 = 1.0 - in_XMM0_Da;
  local_488 = &local_648;
  local_138 = local_168;
  uVar5 = *local_630;
  uVar6 = in_RDX[3];
  local_128._0_4_ = (float)uVar5;
  local_128._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_120._0_4_ = (float)uVar6;
  uStack_120._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_108 = in_XMM0_Da * (float)local_128;
  fStack_104 = in_XMM0_Da * local_128._4_4_;
  fStack_100 = in_XMM0_Da * (float)uStack_120;
  fStack_fc = in_XMM0_Da * uStack_120._4_4_;
  local_460 = &local_498;
  local_388 = CONCAT44(local_474,local_474);
  uStack_380 = CONCAT44(local_474,local_474);
  local_3f8 = &local_438;
  uVar7 = *local_628;
  uVar8 = in_RSI[3];
  local_398._0_4_ = (float)uVar7;
  local_398._4_4_ = (float)((ulong)uVar7 >> 0x20);
  uStack_390._0_4_ = (float)uVar8;
  uStack_390._4_4_ = (float)((ulong)uVar8 >> 0x20);
  local_378 = local_474 * (float)local_398;
  fStack_374 = local_474 * local_398._4_4_;
  fStack_370 = local_474 * (float)uStack_390;
  fStack_36c = local_474 * uStack_390._4_4_;
  local_3d8 = CONCAT44(fStack_374,local_378);
  uStack_3d0 = CONCAT44(fStack_36c,fStack_370);
  local_3e8 = (float)local_648;
  fStack_3e4 = (float)((ulong)local_648 >> 0x20);
  fStack_3e0 = (float)uStack_640;
  fStack_3dc = (float)((ulong)uStack_640 >> 0x20);
  local_3c8 = local_378 + local_3e8;
  fStack_3c4 = fStack_374 + fStack_3e4;
  fStack_3c0 = fStack_370 + fStack_3e0;
  fStack_3bc = fStack_36c + fStack_3dc;
  local_6b8._0_8_ = CONCAT44(fStack_3c4,local_3c8);
  local_6b8._8_8_ = CONCAT44(fStack_3bc,fStack_3c0);
  local_658 = in_RSI + 4;
  local_660 = in_RDX + 4;
  local_650 = &local_6c8;
  local_334 = 1.0 - in_XMM0_Da;
  local_348 = &local_678;
  local_88 = local_b8;
  uVar9 = *local_660;
  uVar10 = in_RDX[5];
  local_78._0_4_ = (float)uVar9;
  local_78._4_4_ = (float)((ulong)uVar9 >> 0x20);
  uStack_70._0_4_ = (float)uVar10;
  uStack_70._4_4_ = (float)((ulong)uVar10 >> 0x20);
  local_58 = in_XMM0_Da * (float)local_78;
  fStack_54 = in_XMM0_Da * local_78._4_4_;
  fStack_50 = in_XMM0_Da * (float)uStack_70;
  fStack_4c = in_XMM0_Da * uStack_70._4_4_;
  local_320 = &local_358;
  local_248 = CONCAT44(local_334,local_334);
  uStack_240 = CONCAT44(local_334,local_334);
  local_2c8 = &local_6c8;
  local_2d0 = &local_358;
  local_260 = &local_2f8;
  uVar11 = *local_658;
  uVar12 = in_RSI[5];
  local_258._0_4_ = (float)uVar11;
  local_258._4_4_ = (float)((ulong)uVar11 >> 0x20);
  uStack_250._0_4_ = (float)uVar12;
  uStack_250._4_4_ = (float)((ulong)uVar12 >> 0x20);
  local_238 = local_334 * (float)local_258;
  fStack_234 = local_334 * local_258._4_4_;
  fStack_230 = local_334 * (float)uStack_250;
  fStack_22c = local_334 * uStack_250._4_4_;
  local_220 = &local_2f8;
  local_298 = CONCAT44(fStack_234,local_238);
  uStack_290 = CONCAT44(fStack_22c,fStack_230);
  local_2b0 = &local_6c8;
  local_2b8 = &local_2f8;
  local_2a8 = (float)local_678;
  fStack_2a4 = (float)((ulong)local_678 >> 0x20);
  fStack_2a0 = (float)uStack_670;
  fStack_29c = (float)((ulong)uStack_670 >> 0x20);
  local_288 = local_238 + local_2a8;
  fStack_284 = fStack_234 + fStack_2a4;
  fStack_280 = fStack_230 + fStack_2a0;
  fStack_27c = fStack_22c + fStack_29c;
  local_278 = &local_6c8;
  local_6c8._0_8_ = CONCAT44(fStack_284,local_288);
  local_6c8._8_8_ = CONCAT44(fStack_27c,fStack_280);
  local_5dc = *(float *)(in_RSI + 6);
  local_5e0 = *(float *)(in_RDX + 6);
  local_4 = 1.0 - in_XMM0_Da;
  local_c = in_XMM0_Da * local_5e0;
  local_5b0 = local_5f0;
  local_5a4 = local_5b4;
  local_598 = local_5b4;
  fStack_594 = local_5b4;
  fStack_590 = local_5b4;
  fStack_58c = local_5b4;
  local_57c = local_5b4;
  local_560 = local_5c8;
  local_550 = local_5a0;
  local_548 = local_5f0;
  local_540 = local_5c8;
  local_530 = local_5f0;
  local_4f8 = local_5f0;
  local_4e8 = local_5a0;
  local_4e0 = local_538;
  local_4d8 = uVar3;
  uStack_4d0 = uVar4;
  local_4a0 = local_538;
  local_480 = local_628;
  local_470 = local_620;
  local_464 = local_474;
  local_458 = local_474;
  fStack_454 = local_474;
  fStack_450 = local_474;
  fStack_44c = local_474;
  local_43c = local_474;
  local_420 = local_488;
  local_418 = local_628;
  local_410 = local_460;
  local_408 = local_620;
  local_400 = local_488;
  local_3f0 = local_620;
  local_3b8 = local_620;
  local_3b0 = local_628;
  local_3a8 = local_460;
  local_3a0 = local_3f8;
  local_398 = uVar7;
  uStack_390 = uVar8;
  local_360 = local_3f8;
  local_340 = local_658;
  local_330 = local_650;
  local_324 = local_334;
  local_318 = local_334;
  fStack_314 = local_334;
  fStack_310 = local_334;
  fStack_30c = local_334;
  local_308 = local_334;
  local_2e0 = local_348;
  local_2d8 = local_658;
  local_2c0 = local_348;
  local_270 = local_658;
  local_268 = local_2d0;
  local_258 = uVar11;
  uStack_250 = uVar12;
  local_1f8 = local_5c8;
  local_1e0 = local_5c8;
  local_1d8 = uVar1;
  uStack_1d0 = uVar2;
  local_1a0 = local_5c8;
  local_190 = local_1e8;
  local_158 = local_630;
  local_148 = local_488;
  local_140 = local_630;
  local_130 = local_488;
  local_128 = uVar5;
  uStack_120 = uVar6;
  local_f0 = local_488;
  local_e0 = local_138;
  local_a8 = local_660;
  local_98 = local_348;
  local_90 = local_660;
  local_80 = local_348;
  local_78 = uVar9;
  uStack_70 = uVar10;
  local_40 = local_348;
  local_30 = local_88;
  local_8 = local_5dc;
  local_678 = CONCAT44(fStack_54,local_58);
  uStack_670 = CONCAT44(fStack_4c,fStack_50);
  local_648 = CONCAT44(fStack_104,local_108);
  uStack_640 = CONCAT44(fStack_fc,fStack_100);
  local_618 = CONCAT44(fStack_1b4,local_1b8);
  uStack_610 = CONCAT44(fStack_1ac,fStack_1b0);
  local_5d8 = local_4c8;
  uStack_5d0 = uStack_4c0;
  local_578 = local_518;
  uStack_570 = uStack_510;
  local_498 = local_388;
  uStack_490 = uStack_380;
  local_438 = local_3d8;
  uStack_430 = uStack_3d0;
  local_358 = local_248;
  uStack_350 = uStack_240;
  local_2f8 = local_298;
  uStack_2f0 = uStack_290;
  PerspectiveCameraData::PerspectiveCameraData
            (in_RDI,(Vec3fa *)&local_6a8[0].field_1,(Vec3fa *)&local_6b8.field_1,
             (Vec3fa *)&local_6c8.field_1,local_4 * local_5dc + local_c);
  return in_RDI;
}

Assistant:

PerspectiveCameraData lerp(const PerspectiveCameraData& a, const PerspectiveCameraData& b, const float t)
      {
        const Vec3fa from = embree::lerp(a.from, b.from, t);
        const Vec3fa to   = embree::lerp(a.to  , b.to  , t);
        const Vec3fa up   = embree::lerp(a.up  , b.up  , t);
        const float  fov  = embree::lerp(a.fov , b.fov , t);
        return PerspectiveCameraData(from,to,up,fov);
      }